

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidr.c++
# Opt level: O1

bool __thiscall kj::CidrRange::matchesFamily(CidrRange *this,int family)

{
  if (family == 10) {
    return true;
  }
  if (family == 2) {
    return this->family == 2;
  }
  return false;
}

Assistant:

bool CidrRange::matchesFamily(int family) const {
  switch (family) {
    case AF_INET:
      return this->family == AF_INET;
    case AF_INET6:
      // Even if we're a v4 CIDR, we can match v6 addresses in the v4-mapped range.
      return true;
    default:
      return false;
  }
}